

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkpar.c
# Opt level: O3

action * get_shifts(int stateno)

{
  int iVar1;
  int iVar2;
  shifts *psVar3;
  action *paVar4;
  Yshort *pYVar5;
  int iVar6;
  action *paVar7;
  ulong uVar8;
  
  psVar3 = shift_table[stateno];
  if ((psVar3 == (shifts *)0x0) || ((long)psVar3->nshifts < 1)) {
    paVar4 = (action *)0x0;
  }
  else {
    uVar8 = (long)psVar3->nshifts + 1;
    pYVar5 = accessing_symbol;
    paVar7 = (action *)0x0;
    iVar6 = start_symbol;
    do {
      iVar1 = psVar3->shift[uVar8 - 2];
      iVar2 = pYVar5[iVar1];
      paVar4 = paVar7;
      if (iVar2 < iVar6) {
        paVar4 = (action *)allocate(0x18);
        paVar4->next = paVar7;
        paVar4->symbol = iVar2;
        paVar4->number = iVar1;
        paVar4->prec = symbol_prec[iVar2];
        paVar4->action_code = '\x01';
        paVar4->assoc = symbol_assoc[iVar2];
        pYVar5 = accessing_symbol;
        iVar6 = start_symbol;
      }
      uVar8 = uVar8 - 1;
      paVar7 = paVar4;
    } while (1 < uVar8);
  }
  return paVar4;
}

Assistant:

action *get_shifts(int stateno)
{
    register action *actions, *temp;
    register shifts *sp;
    register Yshort *to_state;
    register int i, k;
    register int symbol;

    actions = 0;
    sp = shift_table[stateno];
    if (sp)
    {
	to_state = sp->shift;
	for (i = sp->nshifts - 1; i >= 0; i--)
	{
	    k = to_state[i];
	    symbol = accessing_symbol[k];
	    if (ISTOKEN(symbol))
	    {
		temp = NEW(action);
		temp->next = actions;
		temp->symbol = symbol;
		temp->number = k;
		temp->prec = symbol_prec[symbol];
		temp->action_code = SHIFT;
		temp->assoc = symbol_assoc[symbol];
		actions = temp;
	    }
	}
    }
    return (actions);
}